

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

size_t mserialize::detail::
       BuiltinSerializer<std::multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
       ::sizeof_elems(undefined8 param_1)

{
  bool bVar1;
  const_iterator this;
  size_t sVar2;
  pair<const_int,_char> *elem;
  const_iterator __end0;
  const_iterator __begin0;
  multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_> *__range3;
  size_t result;
  multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  undefined8 local_20;
  size_t local_18;
  undefined8 local_10;
  
  local_18 = 0;
  local_20 = param_1;
  local_10 = param_1;
  local_28._M_node =
       (_Base_ptr)
       std::multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>::begin
                 (in_stack_ffffffffffffffc8);
  this = std::multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>::end
                   (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<std::pair<const_int,_char>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_int,_char>_> *)0x190279);
    sVar2 = serialized_size<std::pair<int_const,char>>((pair<const_int,_char> *)0x190286);
    local_18 = sVar2 + local_18;
    std::_Rb_tree_const_iterator<std::pair<const_int,_char>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_char>_> *)this._M_node);
  }
  return local_18;
}

Assistant:

static std::size_t sizeof_elems(
    std::false_type /* value_type is not arithmetic */,
    const Sequence& s
  )
  {
    std::size_t result = 0;
    for (auto&& elem : s)
    {
      result += mserialize::serialized_size<value_type>(elem);
    }
    return result;
  }